

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O3

void fdb_file_handle_close_all(fdb_file_handle *fhandle)

{
  list_elem *plVar1;
  list_elem *plVar2;
  
  pthread_spin_lock(&fhandle->lock);
  plVar2 = fhandle->handles->head;
  while (plVar2 != (list_elem *)0x0) {
    plVar1 = plVar2->next;
    _fdb_close((fdb_kvs_handle *)plVar2[-1].next);
    free(plVar2[-1].next);
    free(&plVar2[-1].next);
    plVar2 = plVar1;
  }
  pthread_spin_unlock(&fhandle->lock);
  return;
}

Assistant:

void fdb_file_handle_close_all(fdb_file_handle *fhandle)
{
    struct list_elem *e;
    struct kvs_opened_node *node;

    spin_lock(&fhandle->lock);
    e = list_begin(fhandle->handles);
    while (e) {
        node = _get_entry(e, struct kvs_opened_node, le);
        e = list_next(e);
        _fdb_close(node->handle);
        free(node->handle);
        free(node);
    }
    spin_unlock(&fhandle->lock);
}